

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription *jobTable,U32 nbJobs,ZSTD_customMem cMem)

{
  uint local_18;
  U32 jobNb;
  U32 nbJobs_local;
  ZSTDMT_jobDescription *jobTable_local;
  
  if (jobTable != (ZSTDMT_jobDescription *)0x0) {
    for (local_18 = 0; local_18 < nbJobs; local_18 = local_18 + 1) {
      pthread_mutex_destroy((pthread_mutex_t *)&jobTable[local_18].job_mutex);
      pthread_cond_destroy((pthread_cond_t *)&jobTable[local_18].job_cond);
    }
    ZSTD_free(jobTable,cMem);
  }
  return;
}

Assistant:

static void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription* jobTable, U32 nbJobs, ZSTD_customMem cMem)
{
    U32 jobNb;
    if (jobTable == NULL) return;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        ZSTD_pthread_mutex_destroy(&jobTable[jobNb].job_mutex);
        ZSTD_pthread_cond_destroy(&jobTable[jobNb].job_cond);
    }
    ZSTD_free(jobTable, cMem);
}